

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O0

TheoryElement * __thiscall Potassco::TheoryData::getElement(TheoryData *this,Id_t id)

{
  bool bVar1;
  TheoryElement **ppTVar2;
  uint in_ESI;
  undefined8 in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  bVar1 = hasElement((TheoryData *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                     (Id_t)((ulong)in_RDI >> 0x20));
  if (!bVar1) {
    fail(-2,"const TheoryElement &Potassco::TheoryData::getElement(Id_t) const",0x149,
         "hasElement(id)","Unknown element \'%u\'",(ulong)in_ESI,0);
  }
  ppTVar2 = elems((TheoryData *)0x142862);
  return ppTVar2[in_ESI];
}

Assistant:

const TheoryElement& TheoryData::getElement(Id_t id) const {
	POTASSCO_REQUIRE(hasElement(id), "Unknown element '%u'", unsigned(id));
	return *elems()[id];
}